

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

char * parse_string(cJSON *item,char *str,char **ep)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  long lVar6;
  byte *pbVar7;
  size_t sVar8;
  byte *pbVar9;
  byte *pbVar10;
  
  if (*str == '\"') {
    sVar8 = 1;
    pbVar9 = (byte *)(str + 1);
    for (pbVar7 = pbVar9; (bVar1 = *pbVar7, bVar1 != 0 && (bVar1 != 0x22));
        pbVar7 = pbVar7 + (ulong)(bVar1 == 0x5c) + 1) {
      sVar8 = sVar8 + 1;
    }
    pbVar5 = (byte *)(*cJSON_malloc)(sVar8);
    if (pbVar5 != (byte *)0x0) {
      item->valuestring = (char *)pbVar5;
      item->type = 0x10;
      do {
        if (pbVar7 <= pbVar9) {
          *pbVar5 = 0;
          return (char *)(pbVar9 + (*pbVar9 == 0x22));
        }
        if (*pbVar9 == 0x5c) {
          bVar1 = pbVar9[1];
          switch(bVar1) {
          case 0x6e:
            *pbVar5 = 10;
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
switchD_00103936_caseD_6f:
            *pbVar5 = bVar1;
            break;
          case 0x72:
            *pbVar5 = 0xd;
            break;
          case 0x74:
            *pbVar5 = 9;
            break;
          case 0x75:
            uVar3 = parse_hex4((char *)(pbVar9 + 2));
            pbVar10 = pbVar9 + 5;
            if (((pbVar7 <= pbVar10) || (uVar3 == 0)) || ((uVar3 & 0xfc00) == 0xdc00)) {
LAB_00103aa5:
              *ep = str;
              return (char *)0x0;
            }
            if ((uVar3 & 0xfc00) == 0xd800) {
              pbVar10 = pbVar9 + 0xb;
              if (((pbVar7 < pbVar10) || (pbVar9[6] != 0x5c)) ||
                 ((pbVar9[7] != 0x75 ||
                  (uVar4 = parse_hex4((char *)(pbVar9 + 8)), uVar4 - 0xe000 < 0xfffffc00))))
              goto LAB_00103aa5;
              pbVar5[3] = (byte)uVar4 & 0x3f | 0x80;
              uVar3 = (uVar3 & 0x3ff) * 0x400 + (uVar4 & 0x3c0) + 0x10000 >> 6;
              lVar2 = 4;
LAB_00103a5c:
              lVar6 = lVar2;
              pbVar5[2] = (byte)uVar3 & 0x3f | 0x80;
              uVar3 = uVar3 >> 6;
LAB_00103a6e:
              pbVar5[1] = (byte)uVar3 & 0x3f | 0x80;
              uVar3 = uVar3 >> 6;
            }
            else {
              if (0x7f < uVar3) {
                lVar6 = 2;
                lVar2 = 3;
                if (0x7ff < uVar3) goto LAB_00103a5c;
                goto LAB_00103a6e;
              }
              lVar6 = 1;
            }
            *pbVar5 = (byte)uVar3 | ""[lVar6];
            pbVar5 = pbVar5 + lVar6;
            goto LAB_00103a34;
          default:
            if (bVar1 == 0x66) {
              *pbVar5 = 0xc;
            }
            else {
              if (bVar1 != 0x62) goto switchD_00103936_caseD_6f;
              *pbVar5 = 8;
            }
          }
          pbVar5 = pbVar5 + 1;
          pbVar10 = pbVar9 + 1;
        }
        else {
          *pbVar5 = *pbVar9;
          pbVar5 = pbVar5 + 1;
          pbVar10 = pbVar9;
        }
LAB_00103a34:
        pbVar9 = pbVar10 + 1;
      } while( true );
    }
  }
  else {
    *ep = str;
  }
  return (char *)0x0;
}

Assistant:

static const char *parse_string(cJSON *item,const char *str,const char **ep)
{
	const char *ptr=str+1,*end_ptr=str+1;char *ptr2;char *out;int len=0;unsigned uc,uc2;
	if (*str!='\"') {*ep=str;return 0;}	/* not a string! */
	
	while (*end_ptr!='\"' && *end_ptr && ++len) if (*end_ptr++ == '\\') end_ptr++;	/* Skip escaped quotes. */
	
	out=(char*)cJSON_malloc(len+1);	/* This is how long we need for the string, roughly. */
	if (!out) return 0;
	item->valuestring=out; /* assign here so out will be deleted during cJSON_Delete() later */
	item->type=cJSON_String;
	
	ptr=str+1;ptr2=out;
	while (ptr < end_ptr)
	{
		if (*ptr!='\\') *ptr2++=*ptr++;
		else
		{
			ptr++;
			switch (*ptr)
			{
				case 'b': *ptr2++='\b';	break;
				case 'f': *ptr2++='\f';	break;
				case 'n': *ptr2++='\n';	break;
				case 'r': *ptr2++='\r';	break;
				case 't': *ptr2++='\t';	break;
				case 'u':	 /* transcode utf16 to utf8. */
					uc=parse_hex4(ptr+1);ptr+=4;	/* get the unicode char. */
					if (ptr >= end_ptr) {*ep=str;return 0;}	/* invalid */
					
					if ((uc>=0xDC00 && uc<=0xDFFF) || uc==0)    {*ep=str;return 0;}	/* check for invalid.   */
					
					if (uc>=0xD800 && uc<=0xDBFF)	/* UTF16 surrogate pairs.	*/
					{
						if (ptr+6 > end_ptr)    {*ep=str;return 0;}	/* invalid */
						if (ptr[1]!='\\' || ptr[2]!='u')    {*ep=str;return 0;}	/* missing second-half of surrogate.    */
						uc2=parse_hex4(ptr+3);ptr+=6;
						if (uc2<0xDC00 || uc2>0xDFFF)       {*ep=str;return 0;}	/* invalid second-half of surrogate.    */
						uc=0x10000 + (((uc&0x3FF)<<10) | (uc2&0x3FF));
					}

					len=4;if (uc<0x80) len=1;else if (uc<0x800) len=2;else if (uc<0x10000) len=3; ptr2+=len;
					
					switch (len) {
						case 4: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 3: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 2: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 1: *--ptr2 =(uc | firstByteMark[len]);
					}
					ptr2+=len;
					break;
				default:  *ptr2++=*ptr; break;
			}
			ptr++;
		}
	}
	*ptr2=0;
	if (*ptr=='\"') ptr++;
	return ptr;
}